

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O1

int dwarf_get_ranges_b(Dwarf_Debug dbg,Dwarf_Off rangesoffset,Dwarf_Die die,Dwarf_Off *actual_offset
                      ,Dwarf_Ranges **rangesbuf,Dwarf_Signed *listlen,Dwarf_Unsigned *bytecount,
                      Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict pDVar1;
  Dwarf_Addr DVar2;
  int iVar3;
  int iVar4;
  Dwarf_Debug pDVar5;
  char *pcVar6;
  undefined8 *puVar7;
  undefined8 *__ptr;
  Dwarf_Ranges *pDVar8;
  uint uVar9;
  Dwarf_Small *pDVar10;
  undefined8 *puVar11;
  Dwarf_Signed errval;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  Dwarf_Unsigned v;
  bool bVar15;
  Dwarf_Half offset_size;
  Dwarf_Half die_version;
  Dwarf_Error localerror;
  dwarfstring m;
  Dwarf_Small *local_d0;
  Dwarf_Half local_bc;
  Dwarf_Half local_ba;
  Dwarf_Debug local_b8;
  undefined8 *local_b0;
  Dwarf_Addr *local_a8;
  ulong local_a0;
  ulong local_98;
  Dwarf_Off *local_90;
  Dwarf_Error local_88;
  long local_80;
  Dwarf_Off local_78;
  Dwarf_Small *local_70;
  ulong local_68;
  Dwarf_Ranges **local_60;
  ulong *local_58;
  dwarfstring_s local_50;
  
  local_88 = (Dwarf_Error)0x0;
  local_ba = 3;
  local_bc = 4;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_b()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  local_60 = rangesbuf;
  local_58 = (ulong *)listlen;
  if (die == (Dwarf_Die)0x0) {
    pDVar10 = &dbg->de_pointer_size;
    v = 0;
  }
  else {
    iVar3 = dwarf_get_version_of_die(die,&local_ba,&local_bc);
    if ((iVar3 == 1) || (pDVar1 = die->di_cu_context, pDVar1 == (Dwarf_CU_Context_conflict)0x0)) {
      errval = 0x68;
      goto LAB_00183b6c;
    }
    if (pDVar1->cc_unit_type == 4) {
      v = 0;
    }
    else {
      v = pDVar1->cc_ranges_base;
    }
    rangesoffset = rangesoffset + v;
    pDVar10 = &pDVar1->cc_address_size;
  }
  local_a0 = (ulong)*pDVar10;
  local_90 = actual_offset;
  iVar3 = _dwarf_load_section(dbg,&dbg->de_debug_ranges,error);
  if (iVar3 == 1) {
    return 1;
  }
  pDVar5 = dbg;
  if (iVar3 == -1) {
    local_b8 = (dbg->de_tied_data).td_tied_object;
    if (local_b8 == (Dwarf_Debug)0x0) {
      return -1;
    }
    iVar3 = _dwarf_load_section(local_b8,&local_b8->de_debug_ranges,&local_88);
    if (iVar3 == -1) {
      return -1;
    }
    pDVar5 = local_b8;
    if (iVar3 == 1) {
      _dwarf_error_mv_s_to_t(local_b8,&local_88,dbg,error);
      return 1;
    }
  }
  uVar12 = (pDVar5->de_debug_ranges).dss_size;
  iVar3 = -1;
  if (uVar12 <= rangesoffset) {
    return -1;
  }
  if (uVar12 <= v) {
    dwarfstring_constructor(&local_50);
    dwarfstring_append_printf_u
              (&local_50,"DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges base is 0x%lx ",v);
    dwarfstring_append_printf_u
              (&local_50," and section size is 0x%lx.",(pDVar5->de_debug_ranges).dss_size);
    pcVar6 = dwarfstring_string(&local_50);
    _dwarf_error_string(dbg,error,0xce,pcVar6);
    dwarfstring_destructor(&local_50);
    return 1;
  }
  local_d0 = (pDVar5->de_debug_ranges).dss_data;
  pDVar10 = local_d0 + uVar12;
  local_d0 = local_d0 + rangesoffset;
  local_80 = -1;
  if ((int)local_a0 != 8) {
    local_80 = 0xffffffff;
  }
  local_68 = (ulong)(uint)((int)local_a0 * 2);
  local_98 = 0;
  local_b0 = (undefined8 *)0x0;
  puVar11 = (undefined8 *)0x0;
  local_b8 = pDVar5;
  local_78 = rangesoffset;
  local_70 = local_d0;
  do {
    iVar13 = 4;
    __ptr = puVar11;
    if (local_d0 != pDVar10) {
      if (pDVar10 < local_d0) {
        while (puVar11 != (undefined8 *)0x0) {
          puVar7 = (undefined8 *)*puVar11;
          free(puVar11);
          puVar11 = puVar7;
        }
        dwarfstring_constructor(&local_50);
        dwarfstring_append(&local_50,
                           "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges pointer ran off the end of the  section"
                          );
        pcVar6 = dwarfstring_string(&local_50);
        _dwarf_error_string(dbg,error,0xce,pcVar6);
        dwarfstring_destructor(&local_50);
        iVar3 = 1;
      }
      else {
        puVar7 = (undefined8 *)calloc(1,0x20);
        if (puVar7 == (undefined8 *)0x0) {
          while (puVar11 != (undefined8 *)0x0) {
            puVar7 = (undefined8 *)*puVar11;
            free(puVar11);
            puVar11 = puVar7;
          }
          _dwarf_error(dbg,error,0xd0);
        }
        else if (pDVar10 < local_d0 + local_68) {
          free(puVar7);
          while (puVar11 != (undefined8 *)0x0) {
            puVar7 = (undefined8 *)*puVar11;
            free(puVar11);
            puVar11 = puVar7;
          }
          _dwarf_error_string(dbg,error,0xce,
                              "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  Not at the end of the ranges section  but there is not enough room in the section  for the next ranges entry"
                             );
        }
        else {
          local_98 = (ulong)((int)local_98 + 1);
          iVar4 = read_unaligned_addr_check
                            (local_b8,puVar7 + 1,local_d0,(uint)local_a0,error,pDVar10);
          if (iVar4 != 0) {
            local_a8 = (Dwarf_Addr *)CONCAT44(local_a8._4_4_,iVar4);
            free(puVar7);
            if (puVar11 == (undefined8 *)0x0) {
              iVar3 = (int)local_a8;
            }
            else {
              do {
                puVar7 = (undefined8 *)*puVar11;
                free(puVar11);
                puVar11 = puVar7;
              } while (puVar7 != (undefined8 *)0x0);
              iVar3 = (int)local_a8;
            }
            goto LAB_00183dc2;
          }
          local_d0 = local_d0 + local_a0;
          local_a8 = puVar7 + 2;
          iVar4 = read_unaligned_addr_check(local_b8,local_a8,local_d0,(uint)local_a0,error,pDVar10)
          ;
          if (iVar4 == 0) {
            __ptr = puVar7;
            if (puVar11 != (undefined8 *)0x0) {
              *local_b0 = puVar7;
              __ptr = puVar11;
            }
            local_d0 = local_d0 + local_a0;
            local_b0 = puVar7;
            if ((puVar7[1] == 0) && (*local_a8 == 0)) {
              *(undefined4 *)(puVar7 + 3) = 2;
            }
            else {
              if (puVar7[1] == local_80) {
                *(undefined4 *)(puVar7 + 3) = 1;
              }
              else {
                *(undefined4 *)(puVar7 + 3) = 0;
              }
              iVar13 = 0;
            }
            goto LAB_00183dc7;
          }
          free(puVar7);
          while (puVar11 != (undefined8 *)0x0) {
            puVar7 = (undefined8 *)*puVar11;
            free(puVar11);
            puVar11 = puVar7;
          }
        }
        iVar3 = 1;
      }
LAB_00183dc2:
      iVar13 = 1;
    }
LAB_00183dc7:
    puVar11 = __ptr;
  } while (iVar13 == 0);
  if (iVar13 != 4) {
    return iVar3;
  }
  uVar14 = (uint)local_98;
  uVar12 = local_98 & 0xffffffff;
  pDVar8 = (Dwarf_Ranges *)_dwarf_get_alloc(dbg,'\x1d',uVar12);
  if (pDVar8 != (Dwarf_Ranges *)0x0) {
    *local_60 = pDVar8;
    *local_58 = uVar12;
    if (uVar14 != 0 && __ptr != (undefined8 *)0x0) {
      uVar9 = 1;
      do {
        *(undefined8 *)&pDVar8->dwr_type = puVar11[3];
        DVar2 = puVar11[2];
        pDVar8->dwr_addr1 = puVar11[1];
        pDVar8->dwr_addr2 = DVar2;
        puVar11 = (undefined8 *)*puVar11;
        if (puVar11 == (undefined8 *)0x0) break;
        pDVar8 = pDVar8 + 1;
        bVar15 = uVar9 < uVar14;
        uVar9 = uVar9 + 1;
      } while (bVar15);
    }
    while (__ptr != (undefined8 *)0x0) {
      puVar11 = (undefined8 *)*__ptr;
      free(__ptr);
      __ptr = puVar11;
    }
    if (local_90 != (Dwarf_Off *)0x0) {
      *local_90 = local_78;
    }
    if (bytecount != (Dwarf_Unsigned *)0x0) {
      *bytecount = (long)local_d0 - (long)local_70;
      return 0;
    }
    return 0;
  }
  while (__ptr != (undefined8 *)0x0) {
    puVar11 = (undefined8 *)*__ptr;
    free(__ptr);
    __ptr = puVar11;
  }
  errval = 0xd0;
LAB_00183b6c:
  _dwarf_error(dbg,error,errval);
  return 1;
}

Assistant:

int dwarf_get_ranges_b(Dwarf_Debug dbg,
    Dwarf_Off rangesoffset,
    Dwarf_Die die,
    Dwarf_Off *actual_offset /* in .debug_ranges */,
    Dwarf_Ranges ** rangesbuf,
    Dwarf_Signed * listlen,
    Dwarf_Unsigned * bytecount,
    Dwarf_Error * error)
{
    Dwarf_Small *rangeptr = 0;
    Dwarf_Small *beginrangeptr = 0;
    Dwarf_Small *section_end = 0;
    unsigned entry_count = 0;
    struct ranges_entry *base = 0;
    struct ranges_entry *last = 0;
    struct ranges_entry *curre = 0;
    Dwarf_Ranges * ranges_data_out = 0;
    unsigned copyindex = 0;
    Dwarf_Half address_size = 0;
    int res = DW_DLV_ERROR;
    Dwarf_Unsigned ranges_base = 0;
    Dwarf_Debug    localdbg = dbg;
    Dwarf_Error    localerror = 0;

    /* default for dwarf_get_ranges() */
    Dwarf_Half     die_version = 3;

    Dwarf_Half offset_size= 4;
    Dwarf_CU_Context cucontext = 0;

    CHECK_DBG(dbg,error,"dwarf_get_ranges_b()");
    address_size = localdbg->de_pointer_size; /* default  */
    if (die) {
        /*  printing by raw offset from DW_AT_ranges attribute.
            If we wind up using the tied file the die_version
            had better match! It cannot be other than a match.
            Can return DW_DLV_ERROR, not DW_DLV_NO_ENTRY.
            Add err code if error.  Version comes from the
            cu context, not the DIE itself. */
        res = dwarf_get_version_of_die(die,&die_version,
            &offset_size);
        if (res == DW_DLV_ERROR) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        if (!die->di_cu_context) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        cucontext = die->di_cu_context;
        /*  The DW4 ranges base was never used in GNU
            but did get emitted, the note says, but
            the note is probably obsolete (so, now wrong).
            http://llvm.1065342.n5.nabble.com/DebugInfo\
            -DW-AT-GNU-ranges-base-in-non-fission-\
            td64194.html
            HOWEVER: in dw4 GNU fission extension
            it is used and matters.
            */
        /*  ranges_base was merged from tied context.
            Otherwise it is zero. But not if
            the current die is the skeleton */
        if (cucontext->cc_unit_type != DW_UT_skeleton) {
            ranges_base = cucontext->cc_ranges_base;
        }
        rangesoffset += ranges_base;
        address_size = cucontext->cc_address_size;
    } else {
        /*  Printing by raw offset
            The caller will use the bytecount to
            increment to the next part of .debug_ranges
            and will call again with the next offset */
    }

    localdbg = dbg;
    res = _dwarf_load_section(localdbg, &localdbg->de_debug_ranges,
        error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        /* data is in a.out, not dwp */
        localdbg = dbg->de_tied_data.td_tied_object;
        if (!localdbg) {
            return DW_DLV_NO_ENTRY;
        }
        res = _dwarf_load_section(localdbg,
            &localdbg->de_debug_ranges, &localerror);
        if (res == DW_DLV_ERROR) {
            _dwarf_error_mv_s_to_t(localdbg,&localerror,dbg,error);
            return res;
        }
        if (res == DW_DLV_NO_ENTRY) {
            return res;
        }
    }

    /*  Be safe in case adding rangesoffset and rangebase
        overflows. */
    if (rangesoffset  >= localdbg->de_debug_ranges.dss_size) {
        /* Documented behavior in libdwarf2.1.mm */
        return DW_DLV_NO_ENTRY;
    }
    if (ranges_base >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base is 0x%lx ",ranges_base);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    if (rangesoffset >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base+offset  is 0x%lx ",
            ranges_base+rangesoffset);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }

    /*  tied address_size must match the dwo address_size */
    section_end = localdbg->de_debug_ranges.dss_data +
        localdbg->de_debug_ranges.dss_size;
    rangeptr = localdbg->de_debug_ranges.dss_data;
#if 0
    if (!rangeslocal) {
        /* printing ranges where range source is dwp,
            here we just assume present. */
    }
#endif
    rangeptr += rangesoffset;
    beginrangeptr = rangeptr;

    for (;;) {
        struct ranges_entry * re = 0;

        if (rangeptr == section_end) {
            break;
        }
        if (rangeptr  > section_end) {
            dwarfstring m;

            free_allocated_ranges(base);
            dwarfstring_constructor(&m);
            dwarfstring_append(&m,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " ranges pointer ran off the end "
                "of the  section");
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        re = calloc(1, sizeof(struct ranges_entry));
        if (!re) {
            free_allocated_ranges(base);
            _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
            return DW_DLV_ERROR;
        }
        if ((rangeptr + (2*address_size)) > section_end) {
            free(re);
            free_allocated_ranges(base);
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " Not at the end of the ranges section "
                " but there is not enough room in the section "
                " for the next ranges entry");
            return  DW_DLV_ERROR;
        }
        entry_count++;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr1,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr2,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        if (!base) {
            base = re;
            last = re;
        } else {
            last->next = re;
            last = re;
        }
        if (re->cur.dwr_addr1 == 0 && re->cur.dwr_addr2 == 0) {
            re->cur.dwr_type =  DW_RANGES_END;
            break;
        } else if (re->cur.dwr_addr1 == MAX_ADDR) {
            re->cur.dwr_type =  DW_RANGES_ADDRESS_SELECTION;
        } else {
            re->cur.dwr_type =  DW_RANGES_ENTRY;
        }
    }

    /* We return ranges on dbg, so use that to allocate. */
    ranges_data_out =   (Dwarf_Ranges *)
        _dwarf_get_alloc(dbg,DW_DLA_RANGES,entry_count);
    if (!ranges_data_out) {
        /* Error, apply to original, not local dbg. */
        free_allocated_ranges(base);
        _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
        return DW_DLV_ERROR;
    }
    curre = base;
    *rangesbuf = ranges_data_out;
    *listlen = entry_count;
    for (copyindex = 0; curre && (copyindex < entry_count);
        ++copyindex,++ranges_data_out,curre=curre->next) {
        *ranges_data_out = curre->cur;
    }
    /* ASSERT: curre == NULL */
    free_allocated_ranges(base);
    base = 0;
    /* Callers will often not care about the bytes used. */
    if (actual_offset) {
        *actual_offset = rangesoffset;
    }
    if (bytecount) {
        *bytecount = rangeptr - beginrangeptr;
    }
    return DW_DLV_OK;
}